

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cache.h
# Opt level: O2

void __thiscall
winmd::reader::cache::add_type_to_members(cache *this,TypeDef *type,namespace_members *members)

{
  undefined8 uVar1;
  undefined4 uVar2;
  bool bVar3;
  category cVar4;
  vector<winmd::reader::TypeDef,_std::allocator<winmd::reader::TypeDef>_> *pvVar5;
  CustomAttribute CVar6;
  TypeDef type_00;
  string_view typeNamespace;
  string_view typeName;
  string_view local_30;
  string_view local_20;
  
  cVar4 = get_category(type);
  switch(cVar4) {
  case interface_type:
    pvVar5 = &members->interfaces;
    break;
  case class_type:
    uVar1 = (type->super_row_base<winmd::reader::TypeDef>).m_table;
    uVar2 = (type->super_row_base<winmd::reader::TypeDef>).m_index;
    type_00.super_row_base<winmd::reader::TypeDef>.m_index = uVar2;
    type_00.super_row_base<winmd::reader::TypeDef>.m_table = (table_base *)uVar1;
    type_00.super_row_base<winmd::reader::TypeDef>._12_4_ = 0;
    typeNamespace._M_str = "System";
    typeNamespace._M_len = 6;
    typeName._M_str = "Attribute";
    typeName._M_len = 9;
    bVar3 = extends_type(type_00,typeNamespace,typeName);
    if (bVar3) {
      pvVar5 = &members->attributes;
    }
    else {
      pvVar5 = &members->classes;
    }
    break;
  case enum_type:
    pvVar5 = &members->enums;
    break;
  case struct_type:
    local_20._M_len = 0x1b;
    local_20._M_str = "Windows.Foundation.Metadata";
    local_30._M_len = 0x14;
    local_30._M_str = "ApiContractAttribute";
    CVar6 = get_attribute<winmd::reader::TypeDef>(type,&local_20,&local_30);
    if (CVar6.super_row_base<winmd::reader::CustomAttribute>.m_table == (table_base *)0x0) {
      pvVar5 = &members->structs;
    }
    else {
      pvVar5 = &members->contracts;
    }
    std::vector<winmd::reader::TypeDef,_std::allocator<winmd::reader::TypeDef>_>::push_back
              (pvVar5,type);
    return;
  case delegate_type:
    pvVar5 = &members->delegates;
    break;
  default:
    return;
  }
  std::vector<winmd::reader::TypeDef,_std::allocator<winmd::reader::TypeDef>_>::push_back
            (pvVar5,type);
  return;
}

Assistant:

void add_type_to_members(TypeDef const& type, namespace_members& members)
        {
            switch (get_category(type))
            {
            case category::interface_type:
                members.interfaces.push_back(type);
                return;
            case category::class_type:
                if (extends_type(type, "System"sv, "Attribute"sv))
                {
                    members.attributes.push_back(type);
                    return;
                }
                members.classes.push_back(type);
                return;
            case category::enum_type:
                members.enums.push_back(type);
                return;
            case category::struct_type:
                if (get_attribute(type, "Windows.Foundation.Metadata"sv, "ApiContractAttribute"sv))
                {
                    members.contracts.push_back(type);
                    return;
                }
                members.structs.push_back(type);
                return;
            case category::delegate_type:
                members.delegates.push_back(type);
                return;
            }
        }